

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void __thiscall
cs_impl::any::holder<cs::object_method>::holder<cs_impl::any_const&,cs_impl::any&>
          (holder<cs::object_method> *this,any *args,any *args_1)

{
  baseHolder *in_RDI;
  baseHolder *this_00;
  undefined1 in_stack_ffffffffffffffcf;
  var *in_stack_ffffffffffffffd0;
  var *in_stack_ffffffffffffffd8;
  object_method *in_stack_ffffffffffffffe0;
  
  baseHolder::baseHolder(in_RDI);
  in_RDI->_vptr_baseHolder = (_func_int **)&PTR__holder_003bd538;
  this_00 = in_RDI + 1;
  any((any *)this_00,(any *)in_RDI);
  any((any *)this_00,(any *)in_RDI);
  cs::object_method::object_method
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf);
  ~any((any *)0x1d5480);
  ~any((any *)0x1d548a);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}